

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O2

void Wln_NtkStaticFanoutStart(Wln_Ntk_t *p)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  long lVar5;
  int iVar6;
  Vec_Int_t t;
  
  p_00 = Vec_IntAlloc(0);
  Wln_NtkCreateRefs(p);
  Wln_NtkStartFanoutMap(p,&p->vFanout,&p->vRefs,1);
  iVar2 = p_00->nCap;
  iVar3 = p_00->nSize;
  piVar4 = p_00->pArray;
  iVar6 = (p->vRefs).nSize;
  piVar1 = (p->vRefs).pArray;
  p_00->nCap = (p->vRefs).nCap;
  p_00->nSize = iVar6;
  p_00->pArray = piVar1;
  (p->vRefs).nCap = iVar2;
  (p->vRefs).nSize = iVar3;
  (p->vRefs).pArray = piVar4;
  Wln_NtkCleanRefs(p);
  for (lVar5 = 1; iVar6 = 1, lVar5 < (p->vTypes).nSize; lVar5 = lVar5 + 1) {
    for (iVar6 = 0; iVar6 < p->vFanins[lVar5].nSize; iVar6 = iVar6 + 1) {
      iVar2 = Wln_ObjFanin(p,(int)lVar5,iVar6);
      if (iVar2 != 0) {
        iVar3 = Wln_ObjRefsInc(p,iVar2);
        piVar4 = Wln_ObjFanouts(p,iVar2);
        piVar4[iVar3] = (int)lVar5;
      }
    }
  }
  do {
    if ((p->vTypes).nSize <= iVar6) {
      Vec_IntFree(p_00);
      return;
    }
    iVar2 = Vec_IntEntry(&p->vRefs,iVar6);
    iVar3 = Vec_IntEntry(p_00,iVar6);
    iVar6 = iVar6 + 1;
  } while (iVar2 == iVar3);
  __assert_fail("Wln_ObjRefs(p, iObj) == Vec_IntEntry(vRefsCopy, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnNtk.c"
                ,0x1a4,"void Wln_NtkStaticFanoutStart(Wln_Ntk_t *)");
}

Assistant:

void Wln_NtkStaticFanoutStart( Wln_Ntk_t * p )
{
    int k, iObj, iFanin;
    Vec_Int_t * vRefsCopy = Vec_IntAlloc(0);
    Wln_NtkCreateRefs( p );
    Wln_NtkStartFanoutMap( p, &p->vFanout, &p->vRefs, 1 );
    ABC_SWAP( Vec_Int_t, *vRefsCopy, p->vRefs );
    // add fanouts
    Wln_NtkCleanRefs( p );
    Wln_NtkForEachObj( p, iObj )
        Wln_ObjForEachFanin( p, iObj, iFanin, k )
            Wln_ObjSetFanout( p, iFanin, Wln_ObjRefsInc(p, iFanin), iObj );
    // double-check the current number of fanouts added
    Wln_NtkForEachObj( p, iObj )
        assert( Wln_ObjRefs(p, iObj) == Vec_IntEntry(vRefsCopy, iObj) );
    Vec_IntFree( vRefsCopy );
}